

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

TVMType __thiscall tvm::runtime::TVMArgValue::operator_cast_to_DLDataType(TVMArgValue *this)

{
  int *x;
  int iVar1;
  TVMType TVar2;
  ostream *poVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  LogCheckError _check_err;
  LogCheckError local_1d0;
  string local_1c8;
  LogMessageFatal local_1a8;
  
  iVar1 = (this->super_TVMPODValue_).type_code_;
  if (iVar1 == 4) {
    TVar2.code = '\x03';
    TVar2.bits = '\0';
    TVar2.lanes = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  else if (iVar1 == 0xb) {
    operator_cast_to_string(&local_1c8,this);
    TVar2 = String2TVMType(&local_1c8);
    uVar6 = (uint)TVar2 >> 8;
    uVar5 = (uint)TVar2 >> 0x10;
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    x = &(this->super_TVMPODValue_).type_code_;
    local_1a8.log_stream_ = (ostringstream)0x5;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_1d0,x,(anon_enum_32 *)&local_1a8);
    if (local_1d0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x23d);
      poVar3 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"type_code_ == kTVMType");
      poVar3 = std::operator<<(poVar3,(string *)local_1d0.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3," expected ");
      poVar3 = std::operator<<(poVar3,"TVMType");
      poVar3 = std::operator<<(poVar3," but get ");
      pcVar4 = TypeCode2Str(*x);
      std::operator<<(poVar3,pcVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1d0);
    TVar2.bits = '\0';
    TVar2.lanes = 0;
    TVar2.code = (this->super_TVMPODValue_).value_.v_type.code;
    uVar6 = (uint)(this->super_TVMPODValue_).value_.v_type.bits;
    uVar5 = (uint)(this->super_TVMPODValue_).value_.v_type.lanes;
  }
  return (TVMType)((uint)TVar2 & 0xff | (uVar6 & 0xff) << 8 | uVar5 << 0x10);
}

Assistant:

operator TVMType() const {
    if (type_code_ == kStr) {
      return String2TVMType(operator std::string());
    }
    // None type
    if (type_code_ == kNull) {
      TVMType t;
      t.code = kHandle;
      t.bits = 0;
      t.lanes = 0;
      return t;
    }
    TVM_CHECK_TYPE_CODE(type_code_, kTVMType);
    return value_.v_type;
  }